

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O3

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float fVar2;
  int _h;
  uint _c;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Allocator *pAVar7;
  int q;
  int iVar8;
  void *pvVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  void *ptr;
  size_t totalsize;
  void *local_90;
  size_t local_88;
  ulong local_80;
  void *local_78;
  int *piStack_70;
  size_t local_68;
  undefined4 local_60;
  Allocator *local_58;
  undefined4 local_50;
  uint local_4c;
  undefined8 local_48;
  long local_40;
  
  iVar8 = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  uVar16 = (ulong)_c;
  sVar3 = bottom_blob->elemsize;
  Mat::create(top_blob,iVar8,_h,_c,sVar3,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  local_40 = (long)(int)_c;
  local_58 = opt->workspace_allocator;
  local_78 = (void *)0x0;
  piStack_70 = (int *)0x0;
  local_60 = 1;
  local_50 = 1;
  local_48 = 0x100000001;
  local_68 = sVar3;
  local_4c = _c;
  if (_c == 0) {
    iVar8 = -100;
  }
  else {
    uVar11 = _h * iVar8;
    uVar14 = sVar3 * local_40 + 3 & 0xfffffffffffffffc;
    local_88 = uVar14 + 4;
    if (local_58 == (Allocator *)0x0) {
      local_90 = (void *)0x0;
      iVar8 = posix_memalign(&local_90,0x10,local_88);
      local_78 = (void *)0x0;
      if (iVar8 == 0) {
        local_78 = local_90;
      }
    }
    else {
      local_78 = (void *)(**(code **)(*(long *)local_58 + 0x10))();
    }
    piStack_70 = (int *)((long)local_78 + uVar14);
    *(undefined4 *)((long)local_78 + uVar14) = 1;
    uVar15 = (ulong)uVar11;
    if (0 < (int)_c) {
      pvVar9 = bottom_blob->data;
      sVar3 = bottom_blob->cstep;
      sVar4 = bottom_blob->elemsize;
      uVar10 = 0;
      do {
        fVar17 = 0.0;
        if (0 < (int)uVar11) {
          uVar12 = 0;
          do {
            fVar17 = fVar17 + *(float *)((long)pvVar9 + uVar12 * 4);
            uVar12 = uVar12 + 1;
          } while (uVar15 != uVar12);
        }
        *(float *)((long)local_78 + uVar10 * 4) = fVar17;
        uVar10 = uVar10 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
      } while (uVar10 != uVar16);
      if (this->across_channels == 0) {
        if (0 < (int)_c) {
          pvVar9 = bottom_blob->data;
          sVar3 = bottom_blob->cstep;
          pvVar13 = top_blob->data;
          sVar4 = top_blob->cstep;
          sVar5 = top_blob->elemsize;
          sVar6 = bottom_blob->elemsize;
          uVar10 = 0;
          do {
            if (0 < (int)uVar11) {
              fVar17 = *(float *)((long)local_78 + uVar10 * 4);
              uVar12 = 0;
              do {
                *(float *)((long)pvVar13 + uVar12 * 4) =
                     *(float *)((long)pvVar9 + uVar12 * 4) - fVar17 * (1.0 / (float)(int)uVar11);
                uVar12 = uVar12 + 1;
              } while (uVar15 != uVar12);
            }
            uVar10 = uVar10 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
            pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
          } while (uVar10 != uVar16);
        }
      }
      else if (0 < (int)_c) {
        fVar17 = 0.0;
        uVar10 = 0;
        do {
          fVar17 = fVar17 + *(float *)((long)local_78 + uVar10 * 4);
          uVar10 = uVar10 + 1;
        } while (uVar16 != uVar10);
        if (0 < (int)_c) {
          pvVar9 = bottom_blob->data;
          sVar3 = bottom_blob->cstep;
          sVar4 = top_blob->cstep;
          sVar5 = top_blob->elemsize;
          pvVar13 = top_blob->data;
          sVar6 = bottom_blob->elemsize;
          uVar10 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar12 = 0;
              do {
                *(float *)((long)pvVar13 + uVar12 * 4) =
                     *(float *)((long)pvVar9 + uVar12 * 4) - fVar17 / (float)(int)(_c * uVar11);
                uVar12 = uVar12 + 1;
              } while (uVar15 != uVar12);
            }
            uVar10 = uVar10 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar4 * sVar5);
            pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar6);
          } while (uVar10 != uVar16);
        }
      }
    }
    iVar8 = 0;
    local_80 = uVar14;
    if (this->normalize_variance != 0) {
      pAVar7 = opt->workspace_allocator;
      if (pAVar7 == (Allocator *)0x0) {
        local_90 = (void *)0x0;
        iVar8 = posix_memalign(&local_90,0x10,local_88);
        pvVar9 = (void *)0x0;
        if (iVar8 == 0) {
          pvVar9 = local_90;
        }
      }
      else {
        pvVar9 = (void *)(**(code **)(*(long *)pAVar7 + 0x10))();
      }
      *(undefined4 *)((long)pvVar9 + local_80) = 1;
      if (0 < (int)_c) {
        pvVar13 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        uVar14 = 0;
        do {
          fVar17 = 0.0;
          if (0 < (int)uVar11) {
            uVar10 = 0;
            do {
              fVar2 = *(float *)((long)pvVar13 + uVar10 * 4);
              fVar17 = fVar17 + fVar2 * fVar2;
              uVar10 = uVar10 + 1;
            } while (uVar15 != uVar10);
          }
          *(float *)((long)pvVar9 + uVar14 * 4) = fVar17;
          uVar14 = uVar14 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
        } while (uVar14 != uVar16);
        if (this->across_channels == 0) {
          if (0 < (int)_c) {
            pvVar13 = top_blob->data;
            sVar3 = top_blob->cstep;
            sVar4 = top_blob->elemsize;
            uVar14 = 0;
            do {
              if (0 < (int)uVar11) {
                fVar17 = *(float *)((long)pvVar9 + uVar14 * 4);
                fVar2 = this->eps;
                uVar10 = 0;
                do {
                  *(float *)((long)pvVar13 + uVar10 * 4) =
                       *(float *)((long)pvVar13 + uVar10 * 4) *
                       (1.0 / (SQRT(fVar17 * (1.0 / (float)(int)uVar11)) + fVar2));
                  uVar10 = uVar10 + 1;
                } while (uVar15 != uVar10);
              }
              uVar14 = uVar14 + 1;
              pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
            } while (uVar14 != uVar16);
          }
        }
        else if (0 < (int)_c) {
          fVar17 = 0.0;
          uVar14 = 0;
          do {
            fVar17 = fVar17 + *(float *)((long)pvVar9 + uVar14 * 4);
            uVar14 = uVar14 + 1;
          } while (uVar16 != uVar14);
          if (0 < (int)_c) {
            fVar2 = this->eps;
            sVar3 = top_blob->cstep;
            sVar4 = top_blob->elemsize;
            pvVar13 = top_blob->data;
            uVar14 = 0;
            do {
              if (0 < (int)uVar11) {
                uVar10 = 0;
                do {
                  *(float *)((long)pvVar13 + uVar10 * 4) =
                       *(float *)((long)pvVar13 + uVar10 * 4) *
                       (1.0 / (SQRT(fVar17 / (float)(int)(_c * uVar11)) + fVar2));
                  uVar10 = uVar10 + 1;
                } while (uVar15 != uVar10);
              }
              uVar14 = uVar14 + 1;
              pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
            } while (uVar14 != uVar16);
          }
        }
      }
      LOCK();
      piVar1 = (int *)((long)pvVar9 + local_80);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (pAVar7 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar7 + 0x18))(pAVar7,pvVar9);
          iVar8 = 0;
          goto LAB_0012f090;
        }
        if (pvVar9 != (void *)0x0) {
          free(pvVar9);
        }
      }
      iVar8 = 0;
    }
  }
LAB_0012f090:
  if (piStack_70 != (int *)0x0) {
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if (local_78 != (void *)0x0) {
          free(local_78);
        }
      }
      else {
        (**(code **)(*(long *)local_58 + 0x18))();
      }
    }
  }
  return iVar8;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = static_cast<float>(sqrt(sqmean) + eps);
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = static_cast<float>(sqrt(sqmean) + eps);
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}